

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O3

bool __thiscall cmGetPropertyCommand::HandleGlobalMode(cmGetPropertyCommand *this)

{
  size_type sVar1;
  cmake *pcVar2;
  char *value;
  string local_40;
  
  sVar1 = (this->Name)._M_string_length;
  if (sVar1 == 0) {
    pcVar2 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    value = cmState::GetGlobalProperty(pcVar2->State,&this->PropertyName);
    StoreResult(this,value);
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"given name for GLOBAL scope.","");
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return sVar1 == 0;
}

Assistant:

bool cmGetPropertyCommand::HandleGlobalMode()
{
  if (!this->Name.empty()) {
    this->SetError("given name for GLOBAL scope.");
    return false;
  }

  // Get the property.
  cmake* cm = this->Makefile->GetCMakeInstance();
  return this->StoreResult(
    cm->GetState()->GetGlobalProperty(this->PropertyName));
}